

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O2

void Gla_ManStop(Gla_Man_t *p)

{
  sat_solver2 *psVar1;
  void *__ptr;
  int *__ptr_00;
  Vec_Int_t *pVVar2;
  Gla_Obj_t *pGVar3;
  long lVar4;
  Gla_Obj_t *pGVar5;
  Gla_Obj_t *pGVar6;
  long lVar7;
  
  if (p->pPars->fVerbose != 0) {
    psVar1 = p->pSat;
    Abc_Print(psVar1->nDBreduces,
              "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  Objs+ = %d\n"
              ,(ulong)(uint)psVar1->size,(ulong)(psVar1->stats).clauses,
              (ulong)(uint)(psVar1->stats).conflicts,(ulong)(psVar1->stats).learnts,
              (ulong)(uint)psVar1->nDBreduces,(ulong)(uint)p->nCexes,(ulong)(uint)p->nObjAdded);
  }
  Rnm_ManStop(p->pRnm,0);
  pVVar2 = p->pvRefis;
  if (pVVar2 != (Vec_Int_t *)0x0) {
    lVar4 = 8;
    for (lVar7 = 0; lVar7 < p->pGia->nObjs; lVar7 = lVar7 + 1) {
      __ptr = *(void **)((long)&pVVar2->nCap + lVar4);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        pVVar2 = p->pvRefis;
        *(undefined8 *)((long)&pVVar2->nCap + lVar4) = 0;
      }
      lVar4 = lVar4 + 0x10;
    }
  }
  pGVar3 = p->pObjs;
  pGVar5 = pGVar3;
  do {
    do {
      pGVar6 = pGVar5;
      pGVar5 = pGVar6 + 1;
      if (pGVar3 + p->nObjs <= pGVar5) {
        Cnf_DataFree(p->pCnf);
        if (p->pGia0 != (Gia_Man_t *)0x0) {
          Gia_ManStop(p->pGia);
        }
        sat_solver2_delete(p->pSat);
        Vec_IntFreeP(&p->vObjCounts);
        Vec_IntFreeP(&p->vAddedNew);
        Vec_IntFreeP(&p->vCoreCounts);
        Vec_IntFreeP(&p->vProofIds);
        Vec_IntFreeP(&p->vTemp);
        Vec_IntFreeP(&p->vAbs);
        if (p->pvRefis != (Vec_Int_t *)0x0) {
          free(p->pvRefis);
          p->pvRefis = (Vec_Int_t *)0x0;
        }
        if (p->pObj2Obj != (uint *)0x0) {
          free(p->pObj2Obj);
          p->pObj2Obj = (uint *)0x0;
        }
        free(p->pObjs);
        free(p);
        return;
      }
      __ptr_00 = pGVar6[1].vFrames.pArray;
    } while (__ptr_00 == (int *)0x0);
    free(__ptr_00);
    pGVar6[1].vFrames.pArray = (int *)0x0;
    pGVar3 = p->pObjs;
  } while( true );
}

Assistant:

void Gla_ManStop( Gla_Man_t * p )
{
    Gla_Obj_t * pGla;
    int i;

    if ( p->pPars->fVerbose )
        Abc_Print( 1, "SAT solver:  Var = %d  Cla = %d  Conf = %d  Lrn = %d  Reduce = %d  Cex = %d  Objs+ = %d\n", 
            sat_solver2_nvars(p->pSat), sat_solver2_nclauses(p->pSat), sat_solver2_nconflicts(p->pSat), 
            sat_solver2_nlearnts(p->pSat), p->pSat->nDBreduces, p->nCexes, p->nObjAdded );

    // stop the refinement manager
//    Gia_ManStopP( &p->pGia2 );
    Rnm_ManStop( p->pRnm, 0 );

    if ( p->pvRefis )
    for ( i = 0; i < Gia_ManObjNum(p->pGia); i++ )
        ABC_FREE( p->pvRefis[i].pArray );
    Gla_ManForEachObj( p, pGla )
        ABC_FREE( pGla->vFrames.pArray );
    Cnf_DataFree( p->pCnf );
    if ( p->pGia0 != NULL )
        Gia_ManStop( p->pGia );
//    Gia_ManStaticFanoutStart( p->pGia0 );
    sat_solver2_delete( p->pSat );
    Vec_IntFreeP( &p->vObjCounts );
    Vec_IntFreeP( &p->vAddedNew );
    Vec_IntFreeP( &p->vCoreCounts );
    Vec_IntFreeP( &p->vProofIds );
    Vec_IntFreeP( &p->vTemp );
    Vec_IntFreeP( &p->vAbs );
    ABC_FREE( p->pvRefis );
    ABC_FREE( p->pObj2Obj );
    ABC_FREE( p->pObjs );
    ABC_FREE( p );
}